

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int read_auth_file(mg_file *filep,read_auth_file_struct *workdata,int depth)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *__s;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  ushort **ppuVar8;
  char *pcVar9;
  mg_file *filep_00;
  undefined4 extraout_EDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar10;
  undefined1 auVar11 [16];
  char md5 [33];
  mg_file fp;
  char local_58 [40];
  
  if (((filep == (mg_file *)0x0) || (workdata == (read_auth_file_struct *)0x0)) || (depth == 0)) {
    return 0;
  }
  pcVar1 = workdata->buf;
  do {
    __stream = (FILE *)(filep->access).fp;
    if ((__stream == (FILE *)0x0) || (pcVar6 = fgets(pcVar1,0x228,__stream), pcVar6 == (char *)0x0))
    {
      return 0;
    }
    sVar7 = strlen(pcVar1);
    while (sVar7 != 0) {
      ppuVar8 = __ctype_b_loc();
      filep_00 = (mg_file *)(ulong)(byte)workdata->buf[sVar7 - 1];
      if (((*ppuVar8)[(long)filep_00] & 0x2002) == 0) {
        workdata->f_user = pcVar1;
        if (workdata->buf[0] == ':') {
          if (workdata->buf[1] == '#') break;
          iVar5 = strncmp(workdata->buf + 1,"include=",8);
          pcVar10 = "%s: syntax error in authorization file: %s";
          pcVar6 = extraout_RDX;
          if (iVar5 == 0) {
            iVar5 = mg_fopen((mg_connection *)(workdata->buf + 9),(char *)0x1,(int)&fp,filep_00);
            pcVar10 = "%s: cannot open authorization file: %s";
            pcVar6 = extraout_RDX_00;
            if (iVar5 != 0) {
              iVar5 = read_auth_file(&fp,workdata,depth + -1);
              mg_fclose(&fp.access);
              if (iVar5 != 0) {
                return 1;
              }
              break;
            }
          }
        }
        else {
          pcVar9 = strchr(pcVar1,0x3a);
          workdata->f_domain = pcVar9;
          pcVar10 = "%s: syntax error in authorization file: %s";
          pcVar6 = extraout_RDX_01;
          if (pcVar9 != (char *)0x0) {
            *pcVar9 = '\0';
            pcVar6 = workdata->f_domain;
            workdata->f_domain = pcVar6 + 1;
            pcVar9 = strchr(pcVar6 + 1,0x3a);
            workdata->f_ha1 = pcVar9;
            pcVar10 = "%s: syntax error in authorization file: %s";
            pcVar6 = extraout_RDX_02;
            if (pcVar9 != (char *)0x0) {
              *pcVar9 = '\0';
              pcVar6 = workdata->f_ha1;
              workdata->f_ha1 = pcVar6 + 1;
              pcVar9 = workdata->f_user;
              iVar5 = strcmp((workdata->ah).user,pcVar9);
              if (iVar5 == 0) {
                pcVar10 = workdata->domain;
                iVar5 = strcmp(pcVar10,workdata->f_domain);
                if (iVar5 == 0) {
                  iVar5 = (workdata->ah).type;
                  if (iVar5 == 2) {
                    pcVar1 = (workdata->conn->request_info).request_method;
                    pcVar9 = (workdata->ah).nonce;
                    pcVar10 = (workdata->ah).nc;
                    pcVar2 = (workdata->ah).cnonce;
                    pcVar3 = (workdata->ah).qop;
                    __s = (workdata->ah).response;
                    auVar11._0_4_ = -(uint)((int)((ulong)pcVar1 >> 0x20) == 0 && (int)pcVar1 == 0);
                    auVar11._4_4_ = -(uint)((int)pcVar9 == 0 && (int)((ulong)pcVar9 >> 0x20) == 0);
                    auVar11._8_4_ = -(uint)((int)((ulong)pcVar10 >> 0x20) == 0 && (int)pcVar10 == 0)
                    ;
                    auVar11._12_4_ = -(uint)((int)pcVar2 == 0 && (int)((ulong)pcVar2 >> 0x20) == 0);
                    iVar5 = movmskps(extraout_EDX,auVar11);
                    if ((__s == (char *)0x0 || pcVar3 == (char *)0x0) || iVar5 != 0) {
                      return 0;
                    }
                    pcVar4 = (workdata->ah).uri;
                    sVar7 = strlen(__s);
                    if (sVar7 != 0x20) {
                      return 0;
                    }
                    mg_md5(md5,pcVar1,":",pcVar4,0);
                    mg_md5(local_58,pcVar6 + 1,":",pcVar9,":",pcVar10,":",pcVar2,":",pcVar3,":",md5,
                           0);
                    iVar5 = mg_strcasecmp(__s,local_58);
                  }
                  else {
                    if (iVar5 != 1) {
                      return 0;
                    }
                    mg_md5(md5,pcVar9,":",pcVar10,":",(workdata->ah).plain_password,0);
                    iVar5 = bcmp(workdata->f_ha1,md5,0x21);
                  }
                  return (uint)(iVar5 == 0);
                }
              }
              break;
            }
          }
        }
        mg_cry_internal_wrap
                  (workdata->conn,(mg_context *)0x0,pcVar6,(uint)filep_00,pcVar10,"read_auth_file",
                   pcVar1);
        break;
      }
      workdata->buf[sVar7 - 1] = '\0';
      sVar7 = sVar7 - 1;
    }
  } while( true );
}

Assistant:

static int
read_auth_file(struct mg_file *filep,
               struct read_auth_file_struct *workdata,
               int depth)
{
	int is_authorized = 0;
	struct mg_file fp;
	size_t l;

	if (!filep || !workdata || (0 == depth)) {
		return 0;
	}

	/* Loop over passwords file */
	while (mg_fgets(workdata->buf, sizeof(workdata->buf), filep) != NULL) {
		l = strlen(workdata->buf);
		while (l > 0) {
			if (isspace((unsigned char)workdata->buf[l - 1])
			    || iscntrl((unsigned char)workdata->buf[l - 1])) {
				l--;
				workdata->buf[l] = 0;
			} else
				break;
		}
		if (l < 1) {
			continue;
		}

		workdata->f_user = workdata->buf;

		if (workdata->f_user[0] == ':') {
			/* user names may not contain a ':' and may not be empty,
			 * so lines starting with ':' may be used for a special purpose
			 */
			if (workdata->f_user[1] == '#') {
				/* :# is a comment */
				continue;
			} else if (!strncmp(workdata->f_user + 1, "include=", 8)) {
				if (mg_fopen(workdata->conn,
				             workdata->f_user + 9,
				             MG_FOPEN_MODE_READ,
				             &fp)) {
					is_authorized = read_auth_file(&fp, workdata, depth - 1);
					(void)mg_fclose(
					    &fp.access); /* ignore error on read only file */

					/* No need to continue processing files once we have a
					 * match, since nothing will reset it back
					 * to 0.
					 */
					if (is_authorized) {
						return is_authorized;
					}
				} else {
					mg_cry_internal(workdata->conn,
					                "%s: cannot open authorization file: %s",
					                __func__,
					                workdata->buf);
				}
				continue;
			}
			/* everything is invalid for the moment (might change in the
			 * future) */
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}

		workdata->f_domain = strchr(workdata->f_user, ':');
		if (workdata->f_domain == NULL) {
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}
		*(char *)(workdata->f_domain) = 0;
		(workdata->f_domain)++;

		workdata->f_ha1 = strchr(workdata->f_domain, ':');
		if (workdata->f_ha1 == NULL) {
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}
		*(char *)(workdata->f_ha1) = 0;
		(workdata->f_ha1)++;

		if (!strcmp(workdata->ah.user, workdata->f_user)
		    && !strcmp(workdata->domain, workdata->f_domain)) {
			switch (workdata->ah.type) {
			case 1: /* Basic */
			{
				char md5[33];
				mg_md5(md5,
				       workdata->f_user,
				       ":",
				       workdata->domain,
				       ":",
				       workdata->ah.plain_password,
				       NULL);
				return 0 == memcmp(workdata->f_ha1, md5, 33);
			}
			case 2: /* Digest */
				return check_password_digest(
				    workdata->conn->request_info.request_method,
				    workdata->f_ha1,
				    workdata->ah.uri,
				    workdata->ah.nonce,
				    workdata->ah.nc,
				    workdata->ah.cnonce,
				    workdata->ah.qop,
				    workdata->ah.response);
			default: /* None/Other/Unknown */
				return 0;
			}
		}
	}

	return is_authorized;
}